

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel_service.hpp
# Opt level: O0

int __thiscall
asio::experimental::detail::channel_service<asio::detail::null_mutex>::shutdown
          (channel_service<asio::detail::null_mutex> *this,int __fd,int __how)

{
  int extraout_EAX;
  base_implementation_type *impl;
  scoped_lock lock;
  op_queue<asio::experimental::detail::channel_operation> ops;
  op_queue<asio::experimental::detail::channel_operation> *in_stack_ffffffffffffffc0;
  base_implementation_type *this_00;
  op_queue<asio::experimental::detail::channel_operation> *in_stack_ffffffffffffffc8;
  op_queue<asio::experimental::detail::channel_operation> *in_stack_ffffffffffffffd0;
  
  asio::detail::op_queue<asio::experimental::detail::channel_operation>::op_queue
            (in_stack_ffffffffffffffc0);
  asio::detail::scoped_lock<asio::detail::posix_mutex>::scoped_lock
            ((scoped_lock<asio::detail::posix_mutex> *)in_stack_ffffffffffffffc0,(posix_mutex *)this
            );
  for (this_00 = this->impl_list_; this_00 != (base_implementation_type *)0x0;
      this_00 = this_00->next_) {
    asio::detail::op_queue<asio::experimental::detail::channel_operation>::
    push<asio::experimental::detail::channel_operation>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  asio::detail::scoped_lock<asio::detail::posix_mutex>::~scoped_lock
            ((scoped_lock<asio::detail::posix_mutex> *)0x0);
  asio::detail::op_queue<asio::experimental::detail::channel_operation>::~op_queue
            ((op_queue<asio::experimental::detail::channel_operation> *)this_00);
  return extraout_EAX;
}

Assistant:

inline void channel_service<Mutex>::shutdown()
{
  // Abandon all pending operations.
  asio::detail::op_queue<channel_operation> ops;
  asio::detail::mutex::scoped_lock lock(mutex_);
  base_implementation_type* impl = impl_list_;
  while (impl)
  {
    ops.push(impl->waiters_);
    impl = impl->next_;
  }
}